

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
TasGrid::Optimizer::evalLagrange
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *nodes,
          vector<double,_std::allocator<double>_> *coeffs,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_type sVar4;
  reference pvVar5;
  const_reference pvVar6;
  int local_4c;
  double dStack_48;
  int i_1;
  double w;
  int i;
  allocator<double> local_2e;
  undefined1 local_2d;
  int local_2c;
  double dStack_28;
  int num_nodes;
  double x_local;
  vector<double,_std::allocator<double>_> *coeffs_local;
  vector<double,_std::allocator<double>_> *nodes_local;
  vector<double,_std::allocator<double>_> *lag;
  
  dStack_28 = x;
  x_local = (double)coeffs;
  coeffs_local = nodes;
  nodes_local = __return_storage_ptr__;
  sVar4 = ::std::vector<double,_std::allocator<double>_>::size(nodes);
  local_2c = (int)sVar4;
  local_2d = 0;
  sVar4 = ::std::vector<double,_std::allocator<double>_>::size(coeffs_local);
  ::std::allocator<double>::allocator(&local_2e);
  ::std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,sVar4,&local_2e);
  ::std::allocator<double>::~allocator(&local_2e);
  pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  *pvVar5 = 1.0;
  for (w._0_4_ = 0; dVar3 = dStack_28, w._0_4_ < local_2c + -1; w._0_4_ = w._0_4_ + 1) {
    pvVar6 = ::std::vector<double,_std::allocator<double>_>::operator[](coeffs_local,(long)w._0_4_);
    dVar1 = *pvVar6;
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)w._0_4_);
    dVar2 = *pvVar5;
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)(w._0_4_ + 1));
    *pvVar5 = (dVar3 - dVar1) * dVar2;
  }
  dStack_48 = 1.0;
  pvVar6 = ::std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)x_local,(long)(local_2c + -1));
  dVar3 = *pvVar6;
  pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                     (__return_storage_ptr__,(long)(local_2c + -1));
  *pvVar5 = *pvVar5 / dVar3;
  for (local_4c = local_2c + -2; dVar3 = dStack_28, -1 < local_4c; local_4c = local_4c + -1) {
    pvVar6 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       (coeffs_local,(long)(local_4c + 1));
    dStack_48 = (dVar3 - *pvVar6) * dStack_48;
    pvVar6 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)x_local,(long)local_4c);
    dVar3 = *pvVar6;
    pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)local_4c);
    *pvVar5 = (dStack_48 / dVar3) * *pvVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> evalLagrange(std::vector<double> const &nodes, std::vector<double> const &coeffs, double x){
    int num_nodes = (int) nodes.size();
    std::vector<double> lag(nodes.size());
    lag[0] = 1.0;
    for(int i=0; i<num_nodes-1; i++){
        lag[i+1] = (x - nodes[i]) * lag[i];
    }
    double w = 1.0;
    lag[num_nodes-1] /= coeffs[num_nodes-1];
    for(int i= num_nodes-2; i>=0; i--){
        w *= (x - nodes[i+1]);
        lag[i] *= w / coeffs[i];
    }
    return lag;
}